

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::FixupFirstLefts1(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  value_type pOVar1;
  bool bVar2;
  OutRec *pOVar3;
  reference ppOVar4;
  OutRec *firstLeft;
  OutRec *outRec;
  size_type i;
  OutRec *NewOutRec_local;
  OutRec *OldOutRec_local;
  Clipper *this_local;
  
  for (outRec = (OutRec *)0x0;
      pOVar3 = (OutRec *)
               std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                         ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                          ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3])),
      outRec < pOVar3; outRec = (OutRec *)((long)&outRec->Idx + 1)) {
    ppOVar4 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(size_type)outRec
                        );
    pOVar1 = *ppOVar4;
    pOVar3 = ParseFirstLeft(pOVar1->FirstLeft);
    if (((pOVar1->Pts != (OutPt *)0x0) && (pOVar3 == OldOutRec)) &&
       (bVar2 = Poly2ContainsPoly1(pOVar1->Pts,NewOutRec->Pts), bVar2)) {
      pOVar1->FirstLeft = NewOutRec;
    }
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts1(OutRec* OldOutRec, OutRec* NewOutRec)
{ 
  //tests if NewOutRec contains the polygon before reassigning FirstLeft
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts  && firstLeft == OldOutRec)
    {
      if (Poly2ContainsPoly1(outRec->Pts, NewOutRec->Pts))
        outRec->FirstLeft = NewOutRec;
    }
  }
}